

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O1

void gen_mffscrn(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGTemp *ts;
  TCGv_i64 ret;
  
  if ((ctx->insns_flags2 & 0x80000) == 0) {
    return;
  }
  if (ctx->fpu_enabled != false) {
    s = ctx->uc->tcg_ctx;
    ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    ret = (TCGv_i64)((long)ts - (long)s);
    tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)ts,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)(ctx->opcode >> 7 & 0x1f0) + 0x12b28);
    tcg_gen_andi_i64_ppc64(s,ret,ret,3);
    gen_helper_mffscrn(ctx,ret);
    tcg_temp_free_internal_ppc64(s,ts);
    return;
  }
  gen_exception(ctx,7);
  return;
}

Assistant:

static void gen_mffscrn(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 t1;

    if (unlikely(!(ctx->insns_flags2 & PPC2_ISA300))) {
        return;
    }

    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }

    t1 = tcg_temp_new_i64(tcg_ctx);
    get_fpr(tcg_ctx, t1, rB(ctx->opcode));
    /* Mask FRB to get just RN.  */
    tcg_gen_andi_i64(tcg_ctx, t1, t1, FP_RN);

    gen_helper_mffscrn(ctx, t1);

    tcg_temp_free_i64(tcg_ctx, t1);
}